

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineFramebufferAttachmentTests.cpp
# Opt level: O1

void vkt::pipeline::anon_unknown_0::addAttachmentTestCasesWithFunctions(TestCaseGroup *group)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  TestContext *testCtx;
  char *pcVar3;
  size_t sVar4;
  TestNode *pTVar5;
  long lVar6;
  uint *puVar7;
  string s;
  CaseDef_conflict1 caseDef [32];
  ostringstream str;
  allocator<char> local_821;
  string local_820;
  string local_800;
  long *local_7e0;
  long local_7d0 [2];
  long *local_7c0 [2];
  long local_7b0 [2];
  string local_7a0 [3];
  ios_base local_730 [232];
  VkImageViewType VStack_648;
  undefined8 uStack_644;
  int iStack_63c;
  undefined8 uStack_638;
  int aiStack_630 [2];
  char local_628 [36];
  undefined8 local_604;
  undefined8 uStack_5fc;
  undefined8 local_5f4;
  undefined8 uStack_5ec;
  undefined1 local_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0;
  undefined8 local_5bc;
  undefined8 uStack_5b4;
  undefined8 local_5ac;
  undefined8 uStack_5a4;
  undefined1 local_59c;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined1 local_578;
  undefined8 local_574;
  undefined8 uStack_56c;
  undefined8 local_564;
  undefined8 uStack_55c;
  undefined1 local_554;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined1 local_530;
  undefined8 local_52c;
  undefined8 uStack_524;
  undefined8 local_51c;
  undefined8 uStack_514;
  undefined1 local_50c;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined1 local_4e8;
  undefined8 local_4e4;
  undefined8 uStack_4dc;
  undefined8 local_4d4;
  undefined8 uStack_4cc;
  undefined1 local_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0;
  undefined8 local_49c;
  undefined8 uStack_494;
  undefined8 local_48c;
  undefined8 uStack_484;
  undefined1 local_47c;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined1 local_458;
  undefined8 local_454;
  undefined8 uStack_44c;
  undefined8 local_444;
  undefined8 uStack_43c;
  undefined1 local_434;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 local_410;
  undefined8 local_40c;
  undefined8 uStack_404;
  undefined8 local_3fc;
  undefined8 uStack_3f4;
  undefined1 local_3ec;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined1 local_3c8;
  undefined8 local_3c4;
  undefined8 uStack_3bc;
  undefined8 local_3b4;
  undefined8 uStack_3ac;
  undefined1 local_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined1 local_380;
  undefined8 local_37c;
  undefined8 uStack_374;
  undefined8 local_36c;
  undefined8 uStack_364;
  undefined1 local_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined1 local_338;
  undefined8 local_334;
  undefined8 uStack_32c;
  undefined8 local_324;
  undefined8 uStack_31c;
  undefined1 local_314;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2f0;
  undefined8 local_2ec;
  undefined8 uStack_2e4;
  undefined8 local_2dc;
  undefined8 uStack_2d4;
  undefined1 local_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined1 local_2a8;
  undefined8 local_2a4;
  undefined8 uStack_29c;
  undefined8 local_294;
  undefined8 uStack_28c;
  undefined1 local_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined1 local_260;
  undefined8 local_25c;
  undefined8 uStack_254;
  undefined8 local_24c;
  undefined8 uStack_244;
  undefined1 local_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined1 local_218;
  undefined8 local_214;
  undefined8 uStack_20c;
  undefined8 local_204;
  undefined8 uStack_1fc;
  undefined1 local_1f4;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined1 local_1d0;
  undefined8 local_1cc;
  undefined8 uStack_1c4;
  undefined8 local_1bc;
  undefined8 uStack_1b4;
  undefined1 local_1ac;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_628[0] = '\0';
  local_628[1] = '\0';
  local_628[2] = '\0';
  local_628[3] = '\0';
  local_628[4] = ' ';
  local_628[5] = '\0';
  local_628[6] = '\0';
  local_628[7] = '\0';
  local_628[8] = '\x01';
  local_628[9] = '\0';
  local_628[10] = '\0';
  local_628[0xb] = '\0';
  local_628[0xc] = '\x01';
  local_628[0xd] = '\0';
  local_628[0xe] = '\0';
  local_628[0xf] = '\0';
  local_628[0x10] = '@';
  local_628[0x11] = '\0';
  local_628[0x12] = '\0';
  local_628[0x13] = '\0';
  local_628[0x14] = '\x01';
  local_628[0x15] = '\0';
  local_628[0x16] = '\0';
  local_628[0x17] = '\0';
  local_628[0x18] = '\x01';
  local_628[0x19] = '\0';
  local_628[0x1a] = '\0';
  local_628[0x1b] = '\0';
  local_628[0x1c] = '\x01';
  local_628[0x1d] = '\0';
  local_628[0x1e] = '\0';
  local_628[0x1f] = '\0';
  local_628[0x20] = 0;
  local_604 = 0x2000000000;
  uStack_5fc = 0x100000001;
  local_5f4 = 0x100000030;
  uStack_5ec = 0x100000001;
  local_5e4 = 0;
  local_5e0 = 0x2000000000;
  uStack_5d8 = 0x100000001;
  local_5d0 = 0x100000027;
  uStack_5c8 = 0x100000001;
  local_5c0 = 0;
  local_5bc = 0x1300000000;
  uStack_5b4 = 0x100000001;
  local_5ac = 0x100000020;
  uStack_5a4 = 0x100000001;
  local_59c = 0;
  local_598 = 0x2000000004;
  uStack_590 = 0x100000001;
  local_588 = 0x100000040;
  uStack_580 = 0x400000001;
  local_578 = 0;
  local_574 = 0x2000000004;
  uStack_56c = 0x100000001;
  local_564 = 0x100000030;
  uStack_55c = 0x400000001;
  local_554 = 0;
  local_550 = 0x2000000004;
  uStack_548 = 0x100000001;
  local_540 = 0x100000027;
  uStack_538 = 0x400000001;
  local_530 = 0;
  local_52c = 0x1300000004;
  uStack_524 = 0x100000001;
  local_51c = 0x100000020;
  uStack_514 = 0x400000001;
  local_50c = 0;
  local_508 = 0x2000000001;
  uStack_500 = 0x100000020;
  local_4f8 = 0x4000000040;
  uStack_4f0 = 0x100000001;
  local_4e8 = 0;
  local_4e4 = 0x2000000001;
  uStack_4dc = 0x100000020;
  local_4d4 = 0x3000000030;
  uStack_4cc = 0x100000001;
  local_4c4 = 0;
  local_4c0 = 0x2000000001;
  uStack_4b8 = 0x100000020;
  local_4b0 = 0x2900000027;
  uStack_4a8 = 0x100000001;
  local_4a0 = 0;
  local_49c = 0x1300000001;
  uStack_494 = 0x10000001b;
  local_48c = 0x2000000020;
  uStack_484 = 0x100000001;
  local_47c = 0;
  local_478 = 0x2000000005;
  uStack_470 = 0x100000020;
  local_468 = 0x4000000040;
  uStack_460 = 0x400000001;
  local_458 = 0;
  local_454 = 0x2000000005;
  uStack_44c = 0x100000020;
  local_444 = 0x3000000030;
  uStack_43c = 0x400000001;
  local_434 = 0;
  local_430 = 0x2000000005;
  uStack_428 = 0x100000020;
  local_420 = 0x2900000027;
  uStack_418 = 0x400000001;
  local_410 = 0;
  local_40c = 0x1300000005;
  uStack_404 = 0x10000001b;
  local_3fc = 0x2000000020;
  uStack_3f4 = 0x400000001;
  local_3ec = 0;
  local_3e8 = 0x2000000003;
  uStack_3e0 = 0x100000020;
  local_3d8 = 0x4000000040;
  uStack_3d0 = 0x600000001;
  local_3c8 = 0;
  local_3c4 = 0x2000000003;
  uStack_3bc = 0x100000020;
  local_3b4 = 0x3000000030;
  uStack_3ac = 0x600000001;
  local_3a4 = 0;
  local_3a0 = 0x2000000003;
  uStack_398 = 0x100000020;
  local_390 = 0x2900000027;
  uStack_388 = 0x600000001;
  local_380 = 0;
  local_37c = 0x1300000003;
  uStack_374 = 0x10000001b;
  local_36c = 0x2000000020;
  uStack_364 = 0x600000001;
  local_35c = 0;
  local_358 = 0x2000000006;
  uStack_350 = 0x100000020;
  local_348 = 0x4000000040;
  uStack_340 = 0xc00000001;
  local_338 = 0;
  local_334 = 0x2000000006;
  uStack_32c = 0x100000020;
  local_324 = 0x3000000030;
  uStack_31c = 0xc00000001;
  local_314 = 0;
  local_310 = 0x2000000006;
  uStack_308 = 0x100000020;
  local_300 = 0x2900000027;
  uStack_2f8 = 0xc00000001;
  local_2f0 = 0;
  local_2ec = 0x1300000006;
  uStack_2e4 = 0x10000001b;
  local_2dc = 0x2000000020;
  uStack_2d4 = 0xc00000001;
  local_2cc = 0;
  local_2c8 = 0x2000000001;
  uStack_2c0 = 0x100000020;
  local_2b8 = 0x4000000040;
  uStack_2b0 = 0x100000001;
  local_2a8 = 1;
  local_2a4 = 0x2000000001;
  uStack_29c = 0x100000020;
  local_294 = 0x3000000030;
  uStack_28c = 0x100000001;
  local_284 = 1;
  local_280 = 0x2000000001;
  uStack_278 = 0x100000020;
  local_270 = 0x2900000027;
  uStack_268 = 0x100000001;
  local_260 = 1;
  local_25c = 0x1300000001;
  uStack_254 = 0x10000001b;
  local_24c = 0x2000000020;
  uStack_244 = 0x100000001;
  local_23c = 1;
  local_238 = 0x2000000005;
  uStack_230 = 0x100000020;
  local_228 = 0x4000000040;
  uStack_220 = 0x400000001;
  local_218 = 1;
  local_214 = 0x2000000005;
  uStack_20c = 0x100000020;
  local_204 = 0x3000000030;
  uStack_1fc = 0x400000001;
  local_1f4 = 1;
  local_1f0 = 0x2000000005;
  uStack_1e8 = 0x100000020;
  local_1e0 = 0x2900000027;
  uStack_1d8 = 0x400000001;
  local_1d0 = 1;
  local_1cc = 0x1300000005;
  uStack_1c4 = 0x10000001b;
  local_1bc = 0x2000000020;
  uStack_1b4 = 0x400000001;
  local_1ac = 1;
  lVar6 = 0x20;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar3 = ::vk::getImageViewTypeName(*(VkImageViewType *)((long)&VStack_648 + lVar6));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_7a0,pcVar3,(allocator<char> *)&local_820);
    std::__cxx11::string::substr((ulong)&local_820,(ulong)local_7a0);
    de::toLower(&local_800,&local_820);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_820._M_dataplus._M_p != &local_820.field_2) {
      operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a0[0]._M_dataplus._M_p != &local_7a0[0].field_2) {
      operator_delete(local_7a0[0]._M_dataplus._M_p,local_7a0[0].field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (char *)CONCAT44(local_800._M_dataplus._M_p._4_4_,(uint)local_800._M_dataplus._M_p);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffff7c8 +
                      (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 0x690);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_800._M_dataplus._M_p._4_4_,(uint)local_800._M_dataplus._M_p) !=
        &local_800.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_800._M_dataplus._M_p._4_4_,(uint)local_800._M_dataplus._M_p),
                      local_800.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7a0);
    std::ostream::operator<<(local_7a0,*(int *)((long)&uStack_644 + lVar6));
    if (1 < *(int *)((long)&uStack_644 + lVar6 + 4)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7a0,"x",1);
      std::ostream::operator<<(local_7a0,*(int *)((long)&uStack_644 + lVar6 + 4));
    }
    if (1 < *(int *)((long)&iStack_63c + lVar6)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7a0,"x",1);
      std::ostream::operator<<(local_7a0,*(int *)((long)&iStack_63c + lVar6));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7a0,"_",1);
    std::ostream::operator<<(local_7a0,*(int *)((long)&uStack_638 + lVar6));
    if (1 < *(int *)((long)aiStack_630 + lVar6 + -4)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7a0,"x",1);
      std::ostream::operator<<(local_7a0,*(int *)((long)aiStack_630 + lVar6 + -4));
    }
    if (1 < *(int *)((long)aiStack_630 + lVar6)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7a0,"x",1);
      std::ostream::operator<<(local_7a0,*(int *)((long)aiStack_630 + lVar6));
    }
    puVar7 = (uint *)((long)aiStack_630 + lVar6 + 4);
    if (1 < *puVar7) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7a0,"_",1);
      std::ostream::_M_insert<unsigned_long>((ulong)local_7a0);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7a0);
    std::ios_base::~ios_base(local_730);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_820._M_dataplus._M_p,
               CONCAT44(local_820._M_string_length._4_4_,(undefined4)local_820._M_string_length));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_820._M_dataplus._M_p != &local_820.field_2) {
      operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
    }
    if (local_628[lVar6] == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_ms",3);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_7c0,(char *)local_7e0,&local_821);
    local_7a0[0]._M_dataplus._M_p = (pointer)&local_7a0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7a0,"");
    uVar2 = *(undefined4 *)((long)&VStack_648 + lVar6);
    local_800._M_dataplus._M_p._4_4_ = CONCAT31(local_800._M_dataplus._M_p._5_3_,local_628[lVar6]);
    local_800._M_dataplus._M_p._0_4_ = *puVar7;
    testCtx = (group->super_TestNode).m_testCtx;
    pTVar5 = (TestNode *)operator_new(0xa8);
    local_1a8[0]._M_dataplus._M_p = *(pointer *)((long)&uStack_644 + lVar6);
    local_1a8[0]._M_string_length._0_4_ = *(undefined4 *)((long)&iStack_63c + lVar6);
    local_820._M_dataplus._M_p = *(pointer *)((long)&uStack_638 + lVar6);
    local_820._M_string_length._0_4_ = *(undefined4 *)((long)aiStack_630 + lVar6);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar5,testCtx,NODETYPE_SELF_VALIDATE,(char *)local_7c0[0],
               local_7a0[0]._M_dataplus._M_p);
    pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d23140;
    pTVar5[1]._vptr_TestNode = (_func_int **)initColorPrograms;
    pTVar5[1].m_testCtx = (TestContext *)test;
    *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = uVar2;
    *(undefined4 *)((long)&pTVar5[1].m_name._M_string_length + 4) =
         (undefined4)local_1a8[0]._M_string_length;
    *(pointer *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = local_1a8[0]._M_dataplus._M_p;
    pTVar5[1].m_name.field_2._M_allocated_capacity = (size_type)local_820._M_dataplus._M_p;
    *(undefined4 *)((long)&pTVar5[1].m_name.field_2 + 8) = (undefined4)local_820._M_string_length;
    *(uint *)((long)&pTVar5[1].m_name.field_2 + 0xc) = (uint)local_800._M_dataplus._M_p;
    *(undefined1 *)&pTVar5[1].m_description._M_dataplus._M_p = local_800._M_dataplus._M_p._4_1_;
    tcu::TestNode::addChild(&group->super_TestNode,pTVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a0[0]._M_dataplus._M_p != &local_7a0[0].field_2) {
      operator_delete(local_7a0[0]._M_dataplus._M_p,local_7a0[0].field_2._M_allocated_capacity + 1);
    }
    if (local_7c0[0] != local_7b0) {
      operator_delete(local_7c0[0],local_7b0[0] + 1);
    }
    if (local_7e0 != local_7d0) {
      operator_delete(local_7e0,local_7d0[0] + 1);
    }
    lVar6 = lVar6 + 0x24;
  } while (lVar6 != 0x4a0);
  local_7a0[0]._M_dataplus._M_p = (pointer)&local_7a0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7a0,"no_attachments","");
  paVar1 = &local_1a8[0].field_2;
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
  pTVar5 = (TestNode *)
           createFunctionCaseWithPrograms<bool>
                     ((group->super_TestNode).m_testCtx,NODETYPE_SELF_VALIDATE,local_7a0,local_1a8,
                      initImagePrograms,testNoAtt,false);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0[0]._M_dataplus._M_p != &local_7a0[0].field_2) {
    operator_delete(local_7a0[0]._M_dataplus._M_p,local_7a0[0].field_2._M_allocated_capacity + 1);
  }
  local_7a0[0]._M_dataplus._M_p = (pointer)&local_7a0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7a0,"no_attachments_ms","");
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
  pTVar5 = (TestNode *)
           createFunctionCaseWithPrograms<bool>
                     ((group->super_TestNode).m_testCtx,NODETYPE_SELF_VALIDATE,local_7a0,local_1a8,
                      initImagePrograms,testNoAtt,true);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0[0]._M_dataplus._M_p != &local_7a0[0].field_2) {
    operator_delete(local_7a0[0]._M_dataplus._M_p,local_7a0[0].field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void addAttachmentTestCasesWithFunctions (tcu::TestCaseGroup* group)
{

	// Add test cases for attachment strictly sizes larger than the framebuffer
	const CaseDef	caseDef[]	=
	{
		// Single-sample test cases
		{ VK_IMAGE_VIEW_TYPE_1D,			IVec3(32, 1, 1),	IVec3(64, 1, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_1D,			IVec3(32, 1, 1),	IVec3(48, 1, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_1D,			IVec3(32, 1, 1),	IVec3(39, 1, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_1D,			IVec3(19, 1, 1),	IVec3(32, 1, 1),	1,		false },

		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		IVec3(32, 1, 1),	IVec3(64, 1, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		IVec3(32, 1, 1),	IVec3(48, 1, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		IVec3(32, 1, 1),	IVec3(39, 1, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		IVec3(19, 1, 1),	IVec3(32, 1, 1),	4,		false },

		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(64, 64, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(48, 48, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(39, 41, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(19, 27, 1),	IVec3(32, 32, 1),	1,		false },

		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(64, 64, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(48, 48, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(39, 41, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(19, 27, 1),	IVec3(32, 32, 1),	4,		false },

		{ VK_IMAGE_VIEW_TYPE_CUBE,			IVec3(32, 32, 1),	IVec3(64, 64, 1),	6,		false },
		{ VK_IMAGE_VIEW_TYPE_CUBE,			IVec3(32, 32, 1),	IVec3(48, 48, 1),	6,		false },
		{ VK_IMAGE_VIEW_TYPE_CUBE,			IVec3(32, 32, 1),	IVec3(39, 41, 1),	6,		false },
		{ VK_IMAGE_VIEW_TYPE_CUBE,			IVec3(19, 27, 1),	IVec3(32, 32, 1),	6,		false },

		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	IVec3(32, 32, 1),	IVec3(64, 64, 1),	6*2,	false },
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	IVec3(32, 32, 1),	IVec3(48, 48, 1),	6*2,	false },
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	IVec3(32, 32, 1),	IVec3(39, 41, 1),	6*2,	false },
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	IVec3(19, 27, 1),	IVec3(32, 32, 1),	6*2,	false },

		// Multi-sample test cases
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(64, 64, 1),	1,		true },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(48, 48, 1),	1,		true },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(39, 41, 1),	1,		true },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(19, 27, 1),	IVec3(32, 32, 1),	1,		true },

		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(64, 64, 1),	4,		true },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(48, 48, 1),	4,		true },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(39, 41, 1),	4,		true },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(19, 27, 1),	IVec3(32, 32, 1),	4,		true },
	};

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(caseDef); ++sizeNdx)
		addFunctionCaseWithPrograms(group, getTestCaseString(caseDef[sizeNdx]).c_str(), "", initColorPrograms, test, caseDef[sizeNdx]);

	// Add tests for the case where there are no color attachments but the
	// fragment shader writes to an image via imageStore().
	addFunctionCaseWithPrograms(group, "no_attachments", "", initImagePrograms, testNoAtt, false);
	addFunctionCaseWithPrograms(group, "no_attachments_ms", "", initImagePrograms, testNoAtt, true);
}